

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_3::DBIter::Next(DBIter *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  long in_FS_OFFSET;
  Slice SVar3;
  Slice local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->valid_ == false) {
    __assert_fail("valid_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_iter.cc"
                  ,0x8e,"virtual void leveldb::(anonymous namespace)::DBIter::Next()");
  }
  if (this->direction_ == kReverse) {
    this->direction_ = kForward;
    iVar1 = (*this->iter_->_vptr_Iterator[2])();
    lVar2 = 0x18;
    if ((char)iVar1 != '\0') {
      lVar2 = 0x30;
    }
    (**(code **)((long)this->iter_->_vptr_Iterator + lVar2))();
  }
  else {
    iVar1 = (*this->iter_->_vptr_Iterator[8])();
    local_20.data_ = (char *)CONCAT44(extraout_var,iVar1);
    SVar3 = ExtractUserKey(&local_20);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (&this->saved_key_,SVar3.data_,SVar3.size_);
    (*this->iter_->_vptr_Iterator[6])();
  }
  iVar1 = (*this->iter_->_vptr_Iterator[2])();
  if ((char)iVar1 == '\0') {
    this->valid_ = false;
    (this->saved_key_)._M_string_length = 0;
    *(this->saved_key_)._M_dataplus._M_p = '\0';
  }
  else {
    FindNextUserEntry(this,true,&this->saved_key_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DBIter::Next() {
  assert(valid_);

  if (direction_ == kReverse) {  // Switch directions?
    direction_ = kForward;
    // iter_ is pointing just before the entries for this->key(),
    // so advance into the range of entries for this->key() and then
    // use the normal skipping code below.
    if (!iter_->Valid()) {
      iter_->SeekToFirst();
    } else {
      iter_->Next();
    }
    if (!iter_->Valid()) {
      valid_ = false;
      saved_key_.clear();
      return;
    }
    // saved_key_ already contains the key to skip past.
  } else {
    // Store in saved_key_ the current key so we skip it below.
    SaveKey(ExtractUserKey(iter_->key()), &saved_key_);

    // iter_ is pointing to current key. We can now safely move to the next to
    // avoid checking current key.
    iter_->Next();
    if (!iter_->Valid()) {
      valid_ = false;
      saved_key_.clear();
      return;
    }
  }

  FindNextUserEntry(true, &saved_key_);
}